

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O3

void DownHeap(INT32 Index)

{
  short sVar1;
  ushort uVar2;
  UINT16 *pUVar3;
  INT32 IVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  IVar4 = mHeapSize;
  pUVar3 = mFreq;
  sVar1 = mHeap[(uint)Index];
  uVar5 = Index * 2;
  uVar6 = (ulong)(uint)Index;
  if ((int)uVar5 <= mHeapSize) {
    uVar2 = mFreq[sVar1];
    do {
      if ((IVar4 <= (int)uVar5) ||
         (uVar7 = (ulong)(uVar5 | 1), pUVar3[mHeap[uVar5]] <= pUVar3[mHeap[uVar7]])) {
        uVar7 = (ulong)uVar5;
      }
      uVar6 = (ulong)(uint)Index;
      if (uVar2 <= pUVar3[mHeap[uVar7]]) break;
      mHeap[(uint)Index] = mHeap[uVar7];
      uVar5 = (uint)uVar7 * 2;
      uVar6 = uVar7;
      Index = (uint)uVar7;
    } while ((int)uVar5 <= IVar4);
  }
  mHeap[uVar6] = sVar1;
  return;
}

Assistant:

STATIC 
VOID 
DownHeap (
  IN INT32 i
  )
{
  INT32 j, k;

  //
  // priority queue: send i-th entry down heap
  //
  
  k = mHeap[i];
  while ((j = 2 * i) <= mHeapSize) {
    if (j < mHeapSize && mFreq[mHeap[j]] > mFreq[mHeap[j + 1]]) {
      j++;
    }
    if (mFreq[k] <= mFreq[mHeap[j]]) {
      break;
    }
    mHeap[i] = mHeap[j];
    i = j;
  }
  mHeap[i] = (INT16)k;
}